

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool Clasp::ClauseCreator::ignoreClause(Solver *s,ClauseRep *c,Status st,uint32 flags)

{
  uint32 uVar1;
  uint32 uVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  Solver *in_RDI;
  uint32 x;
  undefined4 in_stack_ffffffffffffffd0;
  uint3 in_stack_ffffffffffffffd4;
  uint uVar3;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_1;
  
  if ((in_EDX & 3) == 0) {
    local_1 = false;
  }
  else if ((in_EDX & 3) == 2) {
    local_25 = in_EDX != 10 && (in_ECX & 0x10) != 0;
    local_1 = local_25;
  }
  else {
    local_26 = true;
    if (in_EDX != 9) {
      local_27 = false;
      if (in_EDX == 1) {
        local_28 = true;
        if ((in_ECX & 4) == 0) {
          uVar3 = (uint)in_stack_ffffffffffffffd4;
          if ((in_ECX & 8) != 0) {
            Literal::var(*(Literal **)(in_RSI + 8));
            uVar1 = Solver::level((Solver *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                                  (Var)((ulong)in_RDI >> 0x20));
            uVar2 = Solver::rootLevel(in_RDI);
            uVar3 = (uint)(uVar1 <= uVar2) << 0x18;
          }
          local_28 = SUB41(uVar3 >> 0x18,0);
        }
        local_27 = local_28;
      }
      local_26 = local_27;
    }
    local_1 = local_26;
  }
  return local_1;
}

Assistant:

bool ClauseCreator::ignoreClause(const Solver& s, const ClauseRep& c, Status st, uint32 flags) {
	uint32 x = (st & (status_sat|status_unsat));
	if (x == status_open)  { return false; }
	if (x == status_unsat) { return st != status_empty && (flags & clause_not_conflict) != 0; }
	return st == status_subsumed || (st == status_sat && ( (flags & clause_not_sat) != 0 || ((flags & clause_not_root_sat) != 0 && s.level(c.lits[0].var()) <= s.rootLevel())));
}